

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryWriter::writeSourceMapProlog(WasmBinaryWriter *this)

{
  pointer pCVar1;
  ostream *this_00;
  Module *pMVar2;
  ostream oVar3;
  int iVar4;
  ostream *poVar5;
  size_t in_RCX;
  void *__buf;
  long lVar6;
  char *pcVar7;
  anon_class_8_1_8991fb9c aVar8;
  pointer pCVar9;
  pointer local_68;
  undefined1 *puStack_60;
  code *local_58;
  code *pcStack_50;
  LEB<unsigned_int,_unsigned_char> local_3c;
  anon_class_8_1_8991fb9c aStack_38;
  U32LEB ret;
  anon_class_8_1_8991fb9c writeStringVector;
  
  std::__ostream_insert<char,std::char_traits<char>>(this->sourceMap,"{\"version\":3,",0xd);
  pCVar9 = (this->wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pCVar9 == pCVar1) goto LAB_00c717d1;
    iVar4 = std::__cxx11::string::compare((char *)pCVar9);
    if (iVar4 == 0) break;
    pCVar9 = pCVar9 + 1;
  }
  puStack_60 = (undefined1 *)&stack0xffffffffffffffc8;
  aStack_38.this = (WasmBinaryWriter *)0x0;
  pcStack_50 = std::
               _Function_handler<unsigned_char_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp:1211:16)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<unsigned_char_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp:1211:16)>
             ::_M_manager;
  local_68 = pCVar9;
  LEB<unsigned_int,_unsigned_char>::read(&local_3c,(int)&local_68,__buf,in_RCX);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  if ((pCVar9->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish +
      -(long)(pCVar9->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start ==
      (pointer)((long)&((aStack_38.this)->tableOfContents).functionBodies.
                       super__Vector_base<wasm::WasmBinaryWriter::TableOfContents::Entry,_std::allocator<wasm::WasmBinaryWriter::TableOfContents::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_start + (ulong)local_3c.value)) {
    std::__ostream_insert<char,std::char_traits<char>>(this->sourceMap,"\"debugId\":\"",0xb);
    for (aVar8.this = aStack_38.this;
        aVar8.this <
        (WasmBinaryWriter *)
        ((pCVar9->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish +
        -(long)(pCVar9->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
        aVar8.this = (WasmBinaryWriter *)
                     ((long)&((aVar8.this)->tableOfContents).functionBodies.
                             super__Vector_base<wasm::WasmBinaryWriter::TableOfContents::Entry,_std::allocator<wasm::WasmBinaryWriter::TableOfContents::Entry>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1)) {
      this_00 = this->sourceMap;
      poVar5 = this_00 + *(long *)(*(long *)this_00 + -0x18);
      if (this_00[*(long *)(*(long *)this_00 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar5);
        poVar5[0xe0] = oVar3;
        poVar5[0xe1] = (ostream)0x1;
      }
      poVar5[0xe0] = (ostream)0x30;
      lVar6 = *(long *)this_00;
      *(undefined8 *)(this_00 + *(long *)(lVar6 + -0x18) + 0x10) = 2;
      lVar6 = *(long *)(lVar6 + -0x18);
      *(uint *)(this_00 + lVar6 + 0x18) = *(uint *)(this_00 + lVar6 + 0x18) & 0xffffffb5 | 8;
      std::ostream::operator<<
                (this_00,(uint)(byte)(pCVar9->data).super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start
                                     [(long)&((aVar8.this)->tableOfContents).functionBodies.
                                             super__Vector_base<wasm::WasmBinaryWriter::TableOfContents::Entry,_std::allocator<wasm::WasmBinaryWriter::TableOfContents::Entry>_>
                                             ._M_impl.super__Vector_impl_data]);
    }
    poVar5 = this->sourceMap;
    pcVar7 = "\",";
    lVar6 = 2;
  }
  else {
    poVar5 = (ostream *)&std::cerr;
    pcVar7 = "warning: build id section with an incorrect size detected!\n";
    lVar6 = 0x3b;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,lVar6);
LAB_00c717d1:
  pMVar2 = this->wasm;
  if ((pMVar2->debugInfoFile)._M_string_length != 0) {
    poVar5 = this->sourceMap;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"file",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\":\"",3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(pMVar2->debugInfoFile)._M_dataplus._M_p,
                        (pMVar2->debugInfoFile)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\",",2);
  }
  pMVar2 = this->wasm;
  if ((pMVar2->debugInfoSourceRoot)._M_string_length != 0) {
    poVar5 = this->sourceMap;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"sourceRoot",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\":\"",3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(pMVar2->debugInfoSourceRoot)._M_dataplus._M_p,
                        (pMVar2->debugInfoSourceRoot)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\",",2);
  }
  aStack_38.this = this;
  writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
            (&stack0xffffffffffffffc8,"sources",&this->wasm->debugInfoFileNames);
  pMVar2 = this->wasm;
  if ((pMVar2->debugInfoSourcesContent).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pMVar2->debugInfoSourcesContent).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
              (&stack0xffffffffffffffc8,"sourcesContent",&pMVar2->debugInfoSourcesContent);
  }
  writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
            (&stack0xffffffffffffffc8,"names",&this->wasm->debugInfoSymbolNames);
  std::__ostream_insert<char,std::char_traits<char>>(this->sourceMap,"\"mappings\":\"",0xc);
  return;
}

Assistant:

void WasmBinaryWriter::writeSourceMapProlog() {
  *sourceMap << "{\"version\":3,";

  for (const auto& section : wasm->customSections) {
    if (section.name == BinaryConsts::CustomSections::BuildId) {
      U32LEB ret;
      size_t pos = 0;
      ret.read([&]() { return section.data[pos++]; });

      if (section.data.size() != pos + ret.value) {
        std::cerr
          << "warning: build id section with an incorrect size detected!\n";
        break;
      }

      *sourceMap << "\"debugId\":\"";
      for (size_t i = pos; i < section.data.size(); i++) {
        *sourceMap << std::setfill('0') << std::setw(2) << std::hex
                   << static_cast<int>(static_cast<uint8_t>(section.data[i]));
      }
      *sourceMap << "\",";
      break;
    }
  }

  auto writeOptionalString = [&](const char* name, const std::string& str) {
    if (!str.empty()) {
      *sourceMap << "\"" << name << "\":\"" << str << "\",";
    }
  };

  writeOptionalString("file", wasm->debugInfoFile);
  writeOptionalString("sourceRoot", wasm->debugInfoSourceRoot);

  auto writeStringVector = [&](const char* name,
                               const std::vector<std::string>& vec) {
    *sourceMap << "\"" << name << "\":[";
    for (size_t i = 0; i < vec.size(); i++) {
      if (i > 0) {
        *sourceMap << ",";
      }
      *sourceMap << "\"" << vec[i] << "\"";
    }
    *sourceMap << "],";
  };

  writeStringVector("sources", wasm->debugInfoFileNames);

  if (!wasm->debugInfoSourcesContent.empty()) {
    writeStringVector("sourcesContent", wasm->debugInfoSourcesContent);
  }

  // TODO: This field is optional; maybe we should omit if it's empty.
  // TODO: Binaryen actually does not correctly preserve symbol names when it
  // rewrites the mappings. We should maybe just drop them, or else handle
  // them correctly.
  writeStringVector("names", wasm->debugInfoSymbolNames);

  *sourceMap << "\"mappings\":\"";
}